

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O0

SQRESULT declare_stream(HSQUIRRELVM v,SQChar *name,SQUserPointer typetag,SQChar *reg_name,
                       SQRegFunction *methods,SQRegFunction *globals)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  long in_R9;
  SQRegFunction *f_1;
  SQRegFunction *f;
  SQInteger i;
  SQInteger top;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  long local_48;
  SQRESULT local_8;
  
  iVar1 = sq_gettype(in_RDI,0xffffffffffffffff);
  if (iVar1 == 0xa000020) {
    uVar2 = sq_gettop(in_RDI);
    init_streamclass(in_stack_ffffffffffffffb0);
    sq_pushregistrytable(in_RDI);
    sq_pushstring(in_RDI,in_RCX,0xffffffffffffffff);
    sq_pushstring(in_RDI,"std_stream",0xffffffffffffffff);
    lVar3 = sq_get(in_RDI,0xfffffffffffffffd);
    if (lVar3 < 0) {
      sq_settop(in_RDI,uVar2);
      local_8 = -1;
    }
    else {
      sq_newclass(in_RDI,1);
      sq_settypetag(in_RDI,0xffffffffffffffff,in_RDX);
      for (local_48 = 0; *(long *)(in_R8 + local_48 * 0x20) != 0; local_48 = local_48 + 1) {
        puVar4 = (undefined8 *)(in_R8 + local_48 * 0x20);
        sq_pushstring(in_RDI,*puVar4,0xffffffffffffffff);
        sq_newclosure(in_RDI,puVar4[1],0);
        sq_setparamscheck(in_RDI,puVar4[2],puVar4[3]);
        sq_setnativeclosurename(in_RDI,0xffffffffffffffff,*puVar4);
        sq_newslot(in_RDI,0xfffffffffffffffd,0);
      }
      sq_newslot(in_RDI,0xfffffffffffffffd,0);
      sq_pop(in_RDI,1);
      for (local_48 = 0; *(long *)(in_R9 + local_48 * 0x20) != 0; local_48 = local_48 + 1) {
        puVar4 = (undefined8 *)(in_R9 + local_48 * 0x20);
        sq_pushstring(in_RDI,*puVar4,0xffffffffffffffff);
        sq_newclosure(in_RDI,puVar4[1],0);
        sq_setparamscheck(in_RDI,puVar4[2],puVar4[3]);
        sq_setnativeclosurename(in_RDI,0xffffffffffffffff,*puVar4);
        sq_newslot(in_RDI,0xfffffffffffffffd,0);
      }
      sq_pushstring(in_RDI,in_RSI,0xffffffffffffffff);
      sq_pushregistrytable(in_RDI);
      sq_pushstring(in_RDI,in_RCX,0xffffffffffffffff);
      sq_get(in_RDI,0xfffffffffffffffe);
      sq_remove(in_RDI,0xfffffffffffffffe);
      sq_newslot(in_RDI,0xfffffffffffffffd,0);
      sq_settop(in_RDI,uVar2);
      local_8 = 0;
    }
  }
  else {
    local_8 = sq_throwerror(in_RDI,"table expected");
  }
  return local_8;
}

Assistant:

SQRESULT declare_stream(HSQUIRRELVM v,const SQChar* name,SQUserPointer typetag,const SQChar* reg_name,const SQRegFunction *methods,const SQRegFunction *globals)
{
    if(sq_gettype(v,-1) != OT_TABLE)
        return sq_throwerror(v,_SC("table expected"));
    SQInteger top = sq_gettop(v);
    //create delegate
    init_streamclass(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,reg_name,-1);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-3))) {
        sq_newclass(v,SQTrue);
        sq_settypetag(v,-1,typetag);
        SQInteger i = 0;
        while(methods[i].name != 0) {
            const SQRegFunction &f = methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);

        i = 0;
        while(globals[i].name!=0)
        {
            const SQRegFunction &f = globals[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        //register the class in the target table
        sq_pushstring(v,name,-1);
        sq_pushregistrytable(v);
        sq_pushstring(v,reg_name,-1);
        sq_get(v,-2);
        sq_remove(v,-2);
        sq_newslot(v,-3,SQFalse);

        sq_settop(v,top);
        return SQ_OK;
    }
    sq_settop(v,top);
    return SQ_ERROR;
}